

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O2

INT16 oki_adpcm_clock(oki_adpcm_state *adpcm,UINT8 nibble)

{
  short sVar1;
  INT16 IVar2;
  short sVar3;
  
  sVar1 = adpcm->signal + adpcm->diff_lookup[(int)(nibble & 0xf | (int)adpcm->step << 4)];
  adpcm->signal = sVar1;
  sVar3 = 0x7ff;
  if ((0x7ff < sVar1) || (sVar3 = -0x800, sVar1 < -0x800)) {
    sVar1 = sVar3;
    adpcm->signal = sVar1;
  }
  sVar3 = (short)adpcm->index_shift[nibble & 7] + adpcm->step;
  adpcm->step = sVar3;
  IVar2 = 0x30;
  if (sVar3 < 0x31) {
    if (-1 < sVar3) {
      return sVar1;
    }
    IVar2 = 0;
  }
  adpcm->step = IVar2;
  return sVar1;
}

Assistant:

INT16 oki_adpcm_clock(oki_adpcm_state* adpcm, UINT8 nibble)
{
	// update the signal
	adpcm->signal += adpcm->diff_lookup[adpcm->step * 16 + (nibble & 15)];

	// clamp to the maximum
	if (adpcm->signal > 2047)
		adpcm->signal = 2047;
	else if (adpcm->signal < -2048)
		adpcm->signal = -2048;

	// adjust the step size and clamp
	adpcm->step += adpcm->index_shift[nibble & 7];
	if (adpcm->step > 48)
		adpcm->step = 48;
	else if (adpcm->step < 0)
		adpcm->step = 0;

	// return the signal
	return adpcm->signal;
}